

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O3

void assert_solver_result<boost::chrono::duration<long,boost::ratio<1l,1l>>(*)(boost::numeric::ublas::matrix<boost::chrono::duration<long,boost::ratio<1l,1l>>,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<boost::chrono::duration<long,boost::ratio<1l,1l>>,std::allocator<boost::chrono::duration<long,boost::ratio<1l,1l>>>>>const&,unsigned_long,unsigned_long,std::vector<unsigned_long,std::allocator<unsigned_long>>&,std::greater<boost::chrono::duration<long,boost::ratio<1l,1l>>>const&),boost::chrono::duration<long,boost::ratio<1l,1l>>,std::greater<boost::chrono::duration<long,boost::ratio<1l,1l>>>>
               (_func_duration<long,_boost::ratio<1L,_1L>_>_matrix<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>,_std::allocator<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>_>_>_>_ptr_unsigned_long_unsigned_long_vector<unsigned_long,_std::allocator<unsigned_long>_>_ptr_greater<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>_>_ptr
                **solving_function,
               matrix<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>,_std::allocator<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>_>_>_>
               *cost_matrix,duration<long,_boost::ratio<1L,_1L>_> expected_cost,
               vector<unsigned_long,_std::allocator<unsigned_long>_> *expected_assignment,
               greater<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>_> *cost_comparator)

{
  uint_least32_t *puVar1;
  ulong uVar2;
  ulong uVar3;
  shared_count sVar4;
  undefined8 uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  size_t sVar9;
  size_t num_invalid_assignments;
  duration<long,_boost::ratio<1L,_1L>_> *local_190;
  duration<long,_boost::ratio<1L,_1L>_> *local_188;
  size_t expected_num_invalid_assignments;
  assertion_result local_178;
  duration<long,_boost::ratio<1L,_1L>_> **local_160;
  vector<unsigned_long,_std::allocator<unsigned_long>_> assignment;
  undefined **local_128;
  undefined1 local_120;
  undefined8 *local_118;
  duration<long,_boost::ratio<1L,_1L>_> **local_110;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_108;
  duration<long,_boost::ratio<1L,_1L>_> total_cost;
  duration<long,_boost::ratio<1L,_1L>_> expected_cost_local;
  undefined **local_e0;
  undefined1 local_d8;
  undefined8 *local_d0;
  char *local_c8;
  char *local_c0;
  char *local_b8;
  undefined1 *local_b0;
  undefined1 *local_a8;
  char *local_a0;
  char *local_98;
  undefined1 *local_90;
  undefined1 *local_88;
  char *local_80;
  char *local_78;
  undefined1 *local_70;
  undefined1 *local_68;
  char *local_60;
  char *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  char *local_40;
  char *local_38;
  
  assignment.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  assignment.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  assignment.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_108 = expected_assignment;
  expected_cost_local = expected_cost;
  total_cost = (**solving_function)
                         (cost_matrix,cost_matrix->size1_,cost_matrix->size2_,&assignment,
                          cost_comparator);
  local_40 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/abuchegger[P]hungarian-algorithm-cpp/test.cpp"
  ;
  local_38 = "";
  local_50 = &boost::unit_test::basic_cstring<char_const>::null;
  local_48 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_40,0x91);
  local_d8 = 0;
  local_e0 = &PTR__lazy_ostream_00125b90;
  local_d0 = &boost::unit_test::lazy_ostream::inst;
  local_c8 = "";
  local_188 = &total_cost;
  local_190 = &expected_cost_local;
  local_110 = &local_188;
  local_120 = 0;
  local_128 = &PTR__lazy_ostream_00125cc0;
  local_118 = &boost::unit_test::lazy_ostream::inst;
  local_160 = &local_190;
  local_178.m_message.px._0_1_ = 0;
  local_178._0_8_ = &PTR__lazy_ostream_00125cc0;
  local_178.m_message.pn.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  boost::test_tools::tt_detail::report_assertion();
  local_60 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/abuchegger[P]hungarian-algorithm-cpp/test.cpp"
  ;
  local_58 = "";
  local_70 = &boost::unit_test::basic_cstring<char_const>::null;
  local_68 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_60,0x92);
  local_d8 = 0;
  local_e0 = &PTR__lazy_ostream_00125b90;
  local_d0 = &boost::unit_test::lazy_ostream::inst;
  local_c8 = "";
  num_invalid_assignments =
       (long)assignment.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)assignment.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start >> 3;
  expected_num_invalid_assignments = cost_matrix->size1_;
  local_190 = (duration<long,_boost::ratio<1L,_1L>_> *)&expected_num_invalid_assignments;
  local_120 = 0;
  local_128 = &PTR__lazy_ostream_00125bd0;
  local_118 = &boost::unit_test::lazy_ostream::inst;
  local_110 = &local_188;
  local_178.m_message.px._0_1_ = 0;
  local_178._0_8_ = &PTR__lazy_ostream_00125bd0;
  local_178.m_message.pn.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_160 = &local_190;
  local_188 = (duration<long,_boost::ratio<1L,_1L>_> *)&num_invalid_assignments;
  boost::test_tools::tt_detail::report_assertion();
  num_invalid_assignments = 0;
  uVar2 = cost_matrix->size1_;
  uVar3 = cost_matrix->size2_;
  if (uVar2 != 0) {
    uVar6 = (long)assignment.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)assignment.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_start >> 3;
    uVar7 = uVar2 - 1;
    if (uVar6 < uVar2 - 1) {
      uVar7 = uVar6;
    }
    uVar8 = 0;
    sVar9 = 0;
    do {
      if (uVar6 == uVar8) {
        uVar5 = std::__throw_out_of_range_fmt
                          ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                           ,uVar7);
        if (assignment.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(assignment.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        _Unwind_Resume(uVar5);
      }
      if (uVar3 <= assignment.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_start[uVar8]) {
        sVar9 = sVar9 + 1;
        num_invalid_assignments = sVar9;
      }
      uVar8 = uVar8 + 1;
    } while (uVar2 != uVar8);
  }
  expected_num_invalid_assignments = 0;
  if (uVar3 <= uVar2) {
    expected_num_invalid_assignments = uVar2 - uVar3;
  }
  local_80 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/abuchegger[P]hungarian-algorithm-cpp/test.cpp"
  ;
  local_78 = "";
  local_90 = &boost::unit_test::basic_cstring<char_const>::null;
  local_88 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_80,0x9d);
  local_d8 = 0;
  local_e0 = &PTR__lazy_ostream_00125b90;
  local_d0 = &boost::unit_test::lazy_ostream::inst;
  local_c8 = "";
  local_120 = 0;
  local_128 = &PTR__lazy_ostream_00125bd0;
  local_118 = &boost::unit_test::lazy_ostream::inst;
  local_110 = &local_188;
  local_190 = (duration<long,_boost::ratio<1L,_1L>_> *)&expected_num_invalid_assignments;
  local_178.m_message.px._0_1_ = 0;
  local_178._0_8_ = &PTR__lazy_ostream_00125bd0;
  local_178.m_message.pn.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_160 = &local_190;
  local_188 = (duration<long,_boost::ratio<1L,_1L>_> *)&num_invalid_assignments;
  boost::test_tools::tt_detail::report_assertion();
  local_a0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/abuchegger[P]hungarian-algorithm-cpp/test.cpp"
  ;
  local_98 = "";
  local_b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_a8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_a0,0x9f);
  boost::test_tools::tt_detail::equal_coll_impl::operator()
            (&local_178,(equal_coll_impl *)&local_e0,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )assignment.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )assignment.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,
             (__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )(local_108->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
               _M_impl.super__Vector_impl_data._M_start,
             (__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )(local_108->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
               _M_impl.super__Vector_impl_data._M_finish);
  local_120 = 0;
  local_128 = &PTR__lazy_ostream_00125b90;
  local_118 = &boost::unit_test::lazy_ostream::inst;
  local_110 = (duration<long,_boost::ratio<1L,_1L>_> **)0x11e3be;
  local_c0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/abuchegger[P]hungarian-algorithm-cpp/test.cpp"
  ;
  local_b8 = "";
  boost::test_tools::tt_detail::report_assertion
            (&local_178,&local_128,&local_c0,0x9f,1,0xd,4,"assignment.begin()","assignment.end()",
             "expected_assignment.begin()","expected_assignment.end()");
  sVar4.pi_ = local_178.m_message.pn.pi_;
  if (local_178.m_message.pn.pi_ != (sp_counted_base *)0x0) {
    LOCK();
    puVar1 = &(local_178.m_message.pn.pi_)->use_count_;
    *puVar1 = *puVar1 - 1;
    UNLOCK();
    if (*puVar1 == 0) {
      (*(local_178.m_message.pn.pi_)->_vptr_sp_counted_base[2])(local_178.m_message.pn.pi_);
      LOCK();
      puVar1 = &(sVar4.pi_)->weak_count_;
      *puVar1 = *puVar1 - 1;
      UNLOCK();
      if (*puVar1 == 0) {
        (*(sVar4.pi_)->_vptr_sp_counted_base[3])(sVar4.pi_);
      }
    }
  }
  if (assignment.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(assignment.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void assert_solver_result(const SolvingFunction& solving_function, const ublas::matrix<Cost>& cost_matrix,
                          const Cost expected_cost, const std::vector<std::size_t>& expected_assignment,
                          const CostComparator& cost_comparator)
{
  std::vector<std::size_t> assignment;
  const Cost total_cost = solving_function(cost_matrix, cost_matrix.size1(), cost_matrix.size2(), assignment,
                                           cost_comparator);
  BOOST_CHECK_EQUAL(total_cost, expected_cost);
  BOOST_CHECK_EQUAL(assignment.size(), cost_matrix.size1());
  std::size_t num_invalid_assignments = 0;
  for (std::size_t row = 0; row < cost_matrix.size1(); ++row)
  {
    if (assignment.at(row) >= cost_matrix.size2())
    {
      ++num_invalid_assignments;
    }
  }
  const std::size_t expected_num_invalid_assignments = (cost_matrix.size1() > cost_matrix.size2())
                                                       ? cost_matrix.size1() - cost_matrix.size2() : 0;
  BOOST_CHECK_EQUAL(num_invalid_assignments, expected_num_invalid_assignments);
  BOOST_CHECK_EQUAL_COLLECTIONS(assignment.begin(), assignment.end(),
                                expected_assignment.begin(), expected_assignment.end());
}